

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTab.cpp
# Opt level: O3

TypeDescriptor * __thiscall SymTab::getValueFor(SymTab *this,string *vName)

{
  pointer pcVar1;
  iterator iVar2;
  mapped_type *ppTVar3;
  ostream *poVar4;
  key_type local_48;
  
  pcVar1 = (vName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + vName->_M_string_length);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
                  *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar2._M_node != &(this->symTab)._M_t._M_impl.super__Rb_tree_header) {
    ppTVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
              ::operator[](&this->symTab,vName);
    return *ppTVar3;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"SymTab::getValueFor: ");
  poVar4 = std::operator<<(poVar4,(string *)vName);
  std::operator<<(poVar4," has not been defined.\n");
  exit(1);
}

Assistant:

TypeDescriptor *SymTab::getValueFor(std::string vName) {
    if( ! isDefined(vName)) {
        std::cout << "SymTab::getValueFor: " << vName << " has not been defined.\n";
        exit(1);
    }
    TypeDescriptor *value = symTab[vName];
//    if(value->type() == TypeDescriptor::NUMBER) {
//        double numValue = value->getNumber();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << numValue << std::endl;
//    } else if(value->type() == TypeDescriptor::BOOLEAN) {
//        if(value->getBoolean())
//            std::cout << "SymTab::getValueFor: " << vName << " contains true" << std::endl;
//        else{
//            std::cout << "SymTab::getValueFor: " << vName << " contains false" << std::endl;
//        }
//    }else{
//        std::string stringValue = value->getString();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << stringValue << std::endl;
//
//    }
    return value;

}